

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdesc.hpp
# Opt level: O1

void __thiscall soplex::SPxBasisBase<double>::Desc::Desc(Desc *this,SPxSolverBase<double> *base)

{
  Desc *pDVar1;
  Desc *pDVar2;
  
  (this->rowstat).data = (Status *)0x0;
  (this->rowstat).memFactor = 1.2;
  (this->rowstat).thesize = 0;
  (this->rowstat).themax = 1;
  spx_alloc<soplex::SPxBasisBase<double>::Desc::Status*>(&(this->rowstat).data,1);
  (this->colstat).data = (Status *)0x0;
  (this->colstat).memFactor = 1.2;
  (this->colstat).thesize = 0;
  (this->colstat).themax = 1;
  spx_alloc<soplex::SPxBasisBase<double>::Desc::Status*>(&(this->colstat).data,1);
  reSize(this,(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum,
         (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
         thenum);
  pDVar2 = (Desc *)&this->colstat;
  pDVar1 = this;
  if (base->theRep != ROW) {
    pDVar2 = this;
    pDVar1 = (Desc *)&this->colstat;
  }
  this->stat = &pDVar1->rowstat;
  this->costat = &pDVar2->rowstat;
  return;
}

Assistant:

SPxBasisBase<R>::Desc::Desc(const SPxSolverBase<R>& base)
{
   reSize(base.nRows(), base.nCols());

   if(base.rep() == SPxSolverBase<R>::ROW)
   {
      stat   = &rowstat;
      costat = &colstat;
   }
   else
   {
      assert(base.rep() == SPxSolverBase<R>::COLUMN);

      stat   = &colstat;
      costat = &rowstat;
   }

   assert(Desc::isConsistent());
}